

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::MapKeySorter::MapKeyComparator::operator()
          (MapKeyComparator *this,MapKey *a,MapKey *b)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  CppType CVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  int64_t iVar10;
  int64_t iVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 extraout_RAX;
  difference_type __diff;
  string_view sVar17;
  string_view sVar18;
  LogMessage local_30;
  
  CVar3 = MapKey::type(a);
  CVar4 = MapKey::type(b);
  if (CVar3 != CVar4) {
    operator()();
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_30);
    _Unwind_Resume(extraout_RAX);
  }
  CVar3 = MapKey::type(a);
  switch(CVar3) {
  case CPPTYPE_INT32:
    iVar5 = MapKey::GetInt32Value(a);
    iVar6 = MapKey::GetInt32Value(b);
    bVar1 = SBORROW4(iVar5,iVar6);
    bVar2 = iVar5 - iVar6 < 0;
    goto LAB_0048b857;
  case CPPTYPE_INT64:
    iVar10 = MapKey::GetInt64Value(a);
    iVar11 = MapKey::GetInt64Value(b);
    bVar1 = SBORROW8(iVar10,iVar11);
    bVar2 = iVar10 - iVar11 < 0;
LAB_0048b857:
    bVar2 = bVar1 != bVar2;
    break;
  case CPPTYPE_UINT32:
    uVar7 = MapKey::GetUInt32Value(a);
    uVar8 = MapKey::GetUInt32Value(b);
    bVar2 = uVar7 < uVar8;
    break;
  case CPPTYPE_UINT64:
    uVar12 = MapKey::GetUInt64Value(a);
    uVar13 = MapKey::GetUInt64Value(b);
    bVar2 = uVar12 < uVar13;
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x493);
    sVar17._M_str = "Invalid key for map field.";
    sVar17._M_len = 0x1a;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_30,sVar17);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_30);
    bVar2 = true;
    break;
  case CPPTYPE_BOOL:
    bVar1 = MapKey::GetBoolValue(a);
    bVar2 = MapKey::GetBoolValue(b);
    bVar2 = !bVar1 && bVar2;
    break;
  case CPPTYPE_STRING:
    sVar17 = MapKey::GetStringValue(a);
    uVar14 = sVar17._M_len;
    sVar18 = MapKey::GetStringValue(b);
    uVar15 = sVar18._M_len;
    uVar16 = uVar15;
    if (uVar14 < uVar15) {
      uVar16 = uVar14;
    }
    if (uVar16 == 0) {
LAB_0048b8d2:
      uVar16 = 0xffffffff80000000;
      if (-0x80000000 < (long)(uVar14 - uVar15)) {
        uVar16 = uVar14 - uVar15;
      }
      if (0x7ffffffe < (long)uVar16) {
        uVar16 = 0;
      }
    }
    else {
      uVar9 = memcmp(sVar17._M_str,sVar18._M_str,uVar16);
      uVar16 = (ulong)uVar9;
      if (uVar9 == 0) goto LAB_0048b8d2;
    }
    bVar2 = (bool)((byte)(uVar16 >> 0x1f) & 1);
  }
  return bVar2;
}

Assistant:

bool operator()(const MapKey& a, const MapKey& b) const {
      ABSL_DCHECK(a.type() == b.type());
      switch (a.type()) {
#define CASE_TYPE(CppType, CamelCppType)                                \
  case FieldDescriptor::CPPTYPE_##CppType: {                            \
    return a.Get##CamelCppType##Value() < b.Get##CamelCppType##Value(); \
  }
        CASE_TYPE(STRING, String)
        CASE_TYPE(INT64, Int64)
        CASE_TYPE(INT32, Int32)
        CASE_TYPE(UINT64, UInt64)
        CASE_TYPE(UINT32, UInt32)
        CASE_TYPE(BOOL, Bool)
#undef CASE_TYPE

        default:
          ABSL_DLOG(FATAL) << "Invalid key for map field.";
          return true;
      }
    }